

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

bool GEO::String::from_string<bool>(char *s,bool *value)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = strcmp(s,"true");
  bVar3 = true;
  if (iVar2 != 0) {
    iVar2 = strcmp(s,"True");
    bVar3 = true;
    if ((iVar2 != 0) && ((cVar1 = *s, cVar1 != '1' || (bVar3 = true, s[1] != '\0')))) {
      iVar2 = strcmp(s,"false");
      if ((iVar2 == 0) || (iVar2 = strcmp(s,"False"), iVar2 == 0)) {
        bVar3 = false;
      }
      else if ((cVar1 != '0') || (bVar3 = false, s[1] != '\0')) {
        return false;
      }
    }
  }
  *value = bVar3;
  return true;
}

Assistant:

inline bool from_string(const char* s, bool& value) {
            if(strcmp(s, "true") == 0 ||
                strcmp(s, "True") == 0 ||
                strcmp(s, "1") == 0
            ) {
                value = true;
                return true;
            }
            if(strcmp(s, "false") == 0 ||
                strcmp(s, "False") == 0 ||
                strcmp(s, "0") == 0
            ) {
                value = false;
                return true;
            }
            return false;
        }